

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O1

XML_Convert_Result unknown_toUtf8(ENCODING *enc,char **fromP,char *fromLim,char **toP,char *toLim)

{
  char *pcVar1;
  char cVar2;
  byte *pbVar3;
  bool bVar4;
  uint uVar5;
  int c;
  char *__src;
  XML_Convert_Result unaff_EBP;
  char buf [4];
  char local_4c [4];
  ENCODING *local_48;
  char *local_40;
  _func_void_ENCODING_ptr_char_ptr_char_ptr_POSITION_ptr **local_38;
  
  local_38 = &enc[7].updatePosition;
  local_48 = enc;
  local_40 = toLim;
  do {
    pbVar3 = (byte *)*fromP;
    if (pbVar3 == (byte *)fromLim) {
      bVar4 = false;
      unaff_EBP = XML_CONVERT_COMPLETED;
    }
    else {
      pcVar1 = (char *)((long)local_38 + (ulong)*pbVar3 * 4);
      __src = pcVar1 + 1;
      cVar2 = *pcVar1;
      uVar5 = (uint)cVar2;
      if (cVar2 == '\0') {
        c = (*local_48[3].charRefNumber)
                      ((ENCODING *)local_48[3].predefinedEntityName,(char *)pbVar3);
        uVar5 = XmlUtf8Encode(c,local_4c);
        if ((long)(ulong)uVar5 <= (long)toLim - (long)*toP) {
          *fromP = *fromP + ((ulong)*(byte *)((long)local_48[1].scanners + (ulong)(byte)**fromP) - 3
                            );
          __src = local_4c;
          goto LAB_004604f9;
        }
        bVar4 = false;
        unaff_EBP = XML_CONVERT_OUTPUT_EXHAUSTED;
      }
      else if ((long)toLim - (long)*toP < (long)(int)uVar5) {
        bVar4 = false;
        unaff_EBP = XML_CONVERT_OUTPUT_EXHAUSTED;
      }
      else {
        *fromP = (char *)(pbVar3 + 1);
LAB_004604f9:
        memcpy(*toP,__src,(long)(int)uVar5);
        *toP = *toP + (int)uVar5;
        bVar4 = true;
        toLim = local_40;
      }
    }
    if (!bVar4) {
      return unaff_EBP;
    }
  } while( true );
}

Assistant:

static enum XML_Convert_Result PTRCALL
unknown_toUtf8(const ENCODING *enc,
               const char **fromP, const char *fromLim,
               char **toP, const char *toLim)
{
  const struct unknown_encoding *uenc = AS_UNKNOWN_ENCODING(enc);
  char buf[XML_UTF8_ENCODE_MAX];
  for (;;) {
    const char *utf8;
    int n;
    if (*fromP == fromLim)
      return XML_CONVERT_COMPLETED;
    utf8 = uenc->utf8[(unsigned char)**fromP];
    n = *utf8++;
    if (n == 0) {
      int c = uenc->convert(uenc->userData, *fromP);
      n = XmlUtf8Encode(c, buf);
      if (n > toLim - *toP)
        return XML_CONVERT_OUTPUT_EXHAUSTED;
      utf8 = buf;
      *fromP += (AS_NORMAL_ENCODING(enc)->type[(unsigned char)**fromP]
                 - (BT_LEAD2 - 2));
    }
    else {
      if (n > toLim - *toP)
        return XML_CONVERT_OUTPUT_EXHAUSTED;
      (*fromP)++;
    }
    memcpy(*toP, utf8, n);
    *toP += n;
  }
}